

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O1

PDFObject * __thiscall PDFObjectParser::ParseDictionary(PDFObjectParser *this)

{
  size_t *psVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  EStatusCode EVar5;
  int iVar6;
  _Node *p_Var7;
  PDFObject *inOriginal;
  string *psVar8;
  Trace *pTVar9;
  int iVar10;
  bool bVar11;
  string token;
  PDFObjectCastPtr<PDFName> aKey;
  RefCountPtr<PDFObject> aValue;
  PDFDictionary *local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  RefCountPtr<PDFName> local_70;
  string local_60;
  RefCountPtr<PDFObject> local_40;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  EVar5 = IncreaseAndCheckDepth(this);
  if (EVar5 == eSuccess) {
    local_b8 = (PDFDictionary *)operator_new(0x78);
    PDFDictionary::PDFDictionary(local_b8);
    bVar11 = false;
    iVar10 = 0;
    do {
      bVar3 = GetNextToken(this,&local_90);
      if (!bVar3 || iVar10 != 0) break;
      iVar10 = 0;
      bVar11 = false;
      if (scDoubleRightAngle_abi_cxx11_._M_string_length == local_90._M_string_length) {
        if (scDoubleRightAngle_abi_cxx11_._M_string_length == 0) {
          bVar11 = true;
        }
        else {
          iVar6 = bcmp(scDoubleRightAngle_abi_cxx11_._M_dataplus._M_p,local_90._M_dataplus._M_p,
                       scDoubleRightAngle_abi_cxx11_._M_string_length);
          bVar11 = iVar6 == 0;
        }
      }
      if (bVar11) break;
      p_Var7 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          &this->mTokenBuffer,&local_90);
      std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
      psVar1 = &(this->mTokenBuffer).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      inOriginal = ParseNewObject(this);
      local_70.mValue = PDFObjectCast<PDFName>(inOriginal);
      local_70._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9888;
      if (local_70.mValue == (PDFName *)0x0) {
        pTVar9 = Trace::DefaultTrace();
        std::__cxx11::string::substr((ulong)local_b0,(ulong)&local_90);
        Trace::TraceToLog(pTVar9,
                          "PDFObjectParser::ParseDictionary, failure to parse key for a dictionary. token = %s"
                          ,local_b0[0]);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        iVar10 = -1;
        bVar3 = false;
      }
      else {
        local_40.mValue = ParseNewObject(this);
        local_40._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9780;
        bVar3 = local_40.mValue != (PDFObject *)0x0;
        if (local_40.mValue == (PDFObject *)0x0) {
          pTVar9 = Trace::DefaultTrace();
          std::__cxx11::string::substr((ulong)local_b0,(ulong)&local_90);
          Trace::TraceToLog(pTVar9,
                            "PDFObjectParser::ParseDictionary, failure to parse value for a dictionary. token = %s"
                            ,local_b0[0]);
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          iVar10 = -1;
        }
        else {
          psVar8 = PDFName::GetValue_abi_cxx11_(local_70.mValue);
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          pcVar2 = (psVar8->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_60,pcVar2,pcVar2 + psVar8->_M_string_length);
          bVar4 = PDFDictionary::Exists(local_b8,&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          iVar10 = 0;
          if (!bVar4) {
            PDFDictionary::Insert(local_b8,local_70.mValue,local_40.mValue);
          }
        }
        RefCountPtr<PDFObject>::~RefCountPtr(&local_40);
      }
      RefCountPtr<PDFName>::~RefCountPtr(&local_70);
    } while (bVar3);
    EVar5 = DecreaseAndCheckDepth(this);
    if ((bool)(bVar11 & (EVar5 == eSuccess && iVar10 == 0))) goto LAB_001d5089;
    (*(local_b8->super_PDFObject).super_RefCountObject._vptr_RefCountObject[1])();
    pTVar9 = Trace::DefaultTrace();
    std::__cxx11::string::substr((ulong)local_b0,(ulong)&local_90);
    Trace::TraceToLog(pTVar9,
                      "PDFObjectParser::ParseDictionary, failure to parse dictionary, didn\'t find end of array or failure to parse dictionary member object. token = %s"
                      ,local_b0[0]);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
  }
  local_b8 = (PDFDictionary *)0x0;
LAB_001d5089:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return &local_b8->super_PDFObject;
}

Assistant:

PDFObject* PDFObjectParser::ParseDictionary()
{
	PDFDictionary* aDictionary;
	bool dictionaryEndEncountered = false;
	std::string token;
	EStatusCode status = PDFHummus::eSuccess;

	if(IncreaseAndCheckDepth() != eSuccess)
		return NULL;

	aDictionary = new PDFDictionary();

	while(GetNextToken(token) && PDFHummus::eSuccess == status)
	{
		dictionaryEndEncountered = (scDoubleRightAngle == token);
		if(dictionaryEndEncountered)
			break;

		ReturnTokenToBuffer(token);

		// Parse Key
		PDFObjectCastPtr<PDFName> aKey(ParseNewObject());
		if(!aKey)
		{
			status = PDFHummus::eFailure;
			TRACE_LOG1("PDFObjectParser::ParseDictionary, failure to parse key for a dictionary. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
			break;
		}


		// Parse Value
		RefCountPtr<PDFObject> aValue = ParseNewObject();
		if(!aValue)
		{
			status = PDFHummus::eFailure;
			TRACE_LOG1("PDFObjectParser::ParseDictionary, failure to parse value for a dictionary. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
			break;
		}
	

		// all good. i'm gonna be forgiving here and allow skipping duplicate keys. cause it happens
		if(!aDictionary->Exists(aKey->GetValue()))
			aDictionary->Insert(aKey.GetPtr(),aValue.GetPtr());
	}

	if(DecreaseAndCheckDepth() != eSuccess)
		status = eFailure;
		
	if(dictionaryEndEncountered && PDFHummus::eSuccess == status)
	{
		return aDictionary;
	}
	else
	{
		delete aDictionary;
		TRACE_LOG1("PDFObjectParser::ParseDictionary, failure to parse dictionary, didn't find end of array or failure to parse dictionary member object. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
		return NULL;
	}
}